

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O1

LY_ERR parse_module(lysp_yang_ctx *ctx,lysp_module *mod)

{
  lysp_node **siblings;
  lys_module *plVar1;
  lyd_node *plVar2;
  LY_ERR LVar3;
  lysp_submodule *plVar4;
  uint32_t parent_stmt_index;
  char *format;
  LY_VECODE code;
  ly_ctx *plVar5;
  lysp_module *plVar6;
  char **value;
  char *pcVar7;
  char *pcVar8;
  ly_stmt lVar9;
  uint uVar10;
  bool bVar11;
  bool bVar12;
  ly_stmt kw;
  char *word;
  size_t word_len;
  char *buf;
  undefined4 in_stack_ffffffffffffff40;
  ly_stmt in_stack_ffffffffffffff44;
  ly_stmt lVar13;
  char *local_a8;
  size_t local_a0;
  lysp_include **local_98;
  lysp_import **local_90;
  lysp_revision **local_88;
  lysp_node_augment **local_80;
  lysp_deviation **local_78;
  lysp_ext **local_70;
  lysp_feature **local_68;
  lysp_node_grp **local_60;
  lysp_ident **local_58;
  lysp_node_notif **local_50;
  lysp_node_action **local_48;
  lysp_tpdf **local_40;
  char *local_38;
  
  mod->field_0x79 = mod->field_0x79 & 0xfd;
  LVar3 = get_argument(ctx,Y_IDENTIF_ARG,(uint16_t *)0x0,&local_a8,&local_38,&local_a0);
  if (LVar3 != LY_SUCCESS) {
    return LVar3;
  }
  if (local_38 == (char *)0x0) {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar5 = (ly_ctx *)0x0;
    }
    else {
      plVar5 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    pcVar8 = local_a8;
    if (local_a0 == 0) {
      pcVar8 = "";
    }
    LVar3 = lydict_insert(plVar5,pcVar8,local_a0,&mod->mod->name);
  }
  else {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar5 = (ly_ctx *)0x0;
    }
    else {
      plVar5 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    LVar3 = lydict_insert_zc(plVar5,local_a8,&mod->mod->name);
  }
  if (LVar3 != LY_SUCCESS) {
    return LVar3;
  }
  LVar3 = get_keyword(ctx,(ly_stmt *)&stack0xffffffffffffff44,&local_a8,&local_a0);
  if (LVar3 != LY_SUCCESS) {
    return LVar3;
  }
  if (in_stack_ffffffffffffff44 == LY_STMT_SYNTAX_SEMICOLON) {
    bVar12 = true;
  }
  else {
    if (in_stack_ffffffffffffff44 != LY_STMT_SYNTAX_LEFT_BRACE) {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar5 = (ly_ctx *)0x0;
      }
      else {
        plVar5 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      pcVar8 = lyplg_ext_stmt2str(in_stack_ffffffffffffff44);
      ly_vlog(plVar5,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid keyword \"%s\", expected \";\" or \"{\"."
              ,pcVar8);
      return LY_EVALID;
    }
    LVar3 = get_keyword(ctx,(ly_stmt *)&stack0xffffffffffffff44,&local_a8,&local_a0);
    if (LVar3 != LY_SUCCESS) {
      return LVar3;
    }
    bVar12 = in_stack_ffffffffffffff44 == LY_STMT_SYNTAX_RIGHT_BRACE;
  }
  if (!bVar12) {
    local_40 = &mod->typedefs;
    local_48 = &mod->rpcs;
    local_50 = &mod->notifs;
    local_58 = &mod->identities;
    local_60 = &mod->groupings;
    local_68 = &mod->features;
    local_70 = &mod->extensions;
    local_78 = &mod->deviations;
    local_80 = &mod->augments;
    siblings = &mod->data;
    local_88 = &mod->revs;
    local_90 = &mod->imports;
    local_98 = &mod->includes;
    uVar10 = 0;
    lVar9 = LY_STMT_NONE;
    do {
      if ((int)in_stack_ffffffffffffff44 < 0xa0000) {
        if ((int)in_stack_ffffffffffffff44 < 0x800) {
          if ((int)in_stack_ffffffffffffff44 < 0x80) {
            if ((in_stack_ffffffffffffff44 - LY_STMT_NOTIFICATION < 0x40) &&
               ((0x8000000080008001U >>
                 ((ulong)(in_stack_ffffffffffffff44 - LY_STMT_NOTIFICATION) & 0x3f) & 1) != 0)) {
LAB_0017e514:
              uVar10 = 4;
            }
          }
          else if (((in_stack_ffffffffffffff44 == LY_STMT_AUGMENT) ||
                   (in_stack_ffffffffffffff44 == LY_STMT_CHOICE)) ||
                  (in_stack_ffffffffffffff44 == LY_STMT_CONTAINER)) goto LAB_0017e514;
        }
        else if ((int)in_stack_ffffffffffffff44 < 0x4000) {
          if (((in_stack_ffffffffffffff44 == LY_STMT_GROUPING) ||
              (in_stack_ffffffffffffff44 == LY_STMT_LEAF)) ||
             (in_stack_ffffffffffffff44 == LY_STMT_LEAF_LIST)) goto LAB_0017e514;
        }
        else if ((int)in_stack_ffffffffffffff44 < 0x60000) {
          if ((in_stack_ffffffffffffff44 == LY_STMT_LIST) ||
             (in_stack_ffffffffffffff44 == LY_STMT_USES)) goto LAB_0017e514;
        }
        else if ((in_stack_ffffffffffffff44 == LY_STMT_CONTACT) ||
                (in_stack_ffffffffffffff44 == LY_STMT_DESCRIPTION)) goto LAB_0017e796;
      }
      else if ((int)in_stack_ffffffffffffff44 < 0x1e0000) {
        if ((int)in_stack_ffffffffffffff44 < 0x120000) {
          if (((in_stack_ffffffffffffff44 == LY_STMT_DEVIATION) ||
              (in_stack_ffffffffffffff44 == LY_STMT_EXTENSION)) ||
             (in_stack_ffffffffffffff44 == LY_STMT_FEATURE)) goto LAB_0017e514;
        }
        else {
          if (in_stack_ffffffffffffff44 == LY_STMT_IDENTITY) goto LAB_0017e514;
          if (((in_stack_ffffffffffffff44 == LY_STMT_IMPORT) ||
              (in_stack_ffffffffffffff44 == LY_STMT_INCLUDE)) &&
             (bVar11 = 1 < uVar10, uVar10 = 1, bVar11)) goto LAB_0017eb3e;
        }
      }
      else if ((int)in_stack_ffffffffffffff44 < 0x270000) {
        if (in_stack_ffffffffffffff44 != LY_STMT_NAMESPACE) {
          if (in_stack_ffffffffffffff44 == LY_STMT_ORGANIZATION) goto LAB_0017e796;
          if (in_stack_ffffffffffffff44 != LY_STMT_PREFIX) goto LAB_0017e51a;
        }
LAB_0017e506:
        if (uVar10 != 0) {
LAB_0017eb3e:
          if (ctx == (lysp_yang_ctx *)0x0) {
            plVar5 = (ly_ctx *)0x0;
          }
          else {
            plVar5 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          pcVar7 = lyplg_ext_stmt2str(in_stack_ffffffffffffff44);
          pcVar8 = lyplg_ext_stmt2str(lVar9);
          format = "Invalid keyword \"%s\", it cannot appear after \"%s\".";
          code = LYVE_SYNTAX_YANG;
          goto LAB_0017eb2c;
        }
        uVar10 = 0;
      }
      else if ((int)in_stack_ffffffffffffff44 < 0x2f0000) {
        if (in_stack_ffffffffffffff44 == LY_STMT_REFERENCE) {
LAB_0017e796:
          bVar11 = 2 < uVar10;
          uVar10 = 2;
          if (bVar11) goto LAB_0017eb3e;
        }
        else if ((in_stack_ffffffffffffff44 == LY_STMT_REVISION) &&
                (bVar11 = 3 < uVar10, uVar10 = 3, bVar11)) goto LAB_0017eb3e;
      }
      else {
        if (in_stack_ffffffffffffff44 == LY_STMT_TYPEDEF) goto LAB_0017e514;
        if (in_stack_ffffffffffffff44 == LY_STMT_YANG_VERSION) goto LAB_0017e506;
      }
LAB_0017e51a:
      plVar6 = mod;
      lVar13 = in_stack_ffffffffffffff44;
      if ((int)in_stack_ffffffffffffff44 < 0xa0000) {
        if ((int)in_stack_ffffffffffffff44 < 0x800) {
          if ((int)in_stack_ffffffffffffff44 < 0x40) {
            if (in_stack_ffffffffffffff44 == LY_STMT_NOTIFICATION) {
              LVar3 = parse_notif(ctx,(lysp_node *)0x0,local_50);
            }
            else {
              if (in_stack_ffffffffffffff44 != LY_STMT_RPC) {
                if (in_stack_ffffffffffffff44 != LY_STMT_ANYDATA) goto LAB_0017eb89;
                plVar2 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                if (1 < *(byte *)&plVar2[2].schema) goto LAB_0017e690;
                if (ctx == (lysp_yang_ctx *)0x0) {
                  plVar5 = (ly_ctx *)0x0;
                }
                else {
                  plVar5 = (ly_ctx *)**(undefined8 **)plVar2;
                }
                format = 
                "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                ;
                pcVar7 = "anydata";
                goto LAB_0017eb1e;
              }
              LVar3 = parse_action(ctx,(lysp_node *)0x0,local_48);
            }
          }
          else if ((int)in_stack_ffffffffffffff44 < 0x200) {
            if (in_stack_ffffffffffffff44 == LY_STMT_ANYXML) {
LAB_0017e690:
              LVar3 = parse_any(ctx,in_stack_ffffffffffffff44,(lysp_node *)0x0,siblings);
            }
            else {
              if (in_stack_ffffffffffffff44 != LY_STMT_AUGMENT) {
LAB_0017eb89:
                if (ctx == (lysp_yang_ctx *)0x0) {
                  plVar5 = (ly_ctx *)0x0;
                }
                else {
                  plVar5 = (ly_ctx *)
                           **(undefined8 **)
                             (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                }
                pcVar7 = lyplg_ext_stmt2str(in_stack_ffffffffffffff44);
                format = "Invalid keyword \"%s\" as a child of \"%s\".";
                pcVar8 = "module";
                code = LYVE_SYNTAX_YANG;
                goto LAB_0017eb2c;
              }
              LVar3 = parse_augment(ctx,(lysp_node *)0x0,local_80);
            }
          }
          else if (in_stack_ffffffffffffff44 == LY_STMT_CHOICE) {
            LVar3 = parse_choice(ctx,(lysp_node *)0x0,siblings);
          }
          else {
            if (in_stack_ffffffffffffff44 != LY_STMT_CONTAINER) goto LAB_0017eb89;
            LVar3 = parse_container(ctx,(lysp_node *)0x0,siblings);
          }
        }
        else if ((int)in_stack_ffffffffffffff44 < 0x4000) {
          if (in_stack_ffffffffffffff44 == LY_STMT_GROUPING) {
            LVar3 = parse_grouping(ctx,(lysp_node *)0x0,local_60);
          }
          else if (in_stack_ffffffffffffff44 == LY_STMT_LEAF) {
            LVar3 = parse_leaf(ctx,(lysp_node *)0x0,siblings);
          }
          else {
            if (in_stack_ffffffffffffff44 != LY_STMT_LEAF_LIST) goto LAB_0017eb89;
            LVar3 = parse_leaflist(ctx,(lysp_node *)0x0,siblings);
          }
        }
        else {
          if (0x5ffff < (int)in_stack_ffffffffffffff44) {
            if (in_stack_ffffffffffffff44 == LY_STMT_CONTACT) {
              parent_stmt_index = (int)mod->mod + 0x38;
              lVar9 = LY_STMT_CONTACT;
            }
            else {
              if (in_stack_ffffffffffffff44 != LY_STMT_DESCRIPTION) goto LAB_0017eb89;
              parent_stmt_index = (int)mod->mod + 0x40;
              lVar9 = LY_STMT_DESCRIPTION;
              plVar6 = (lysp_module *)mod->mod->dsc;
            }
            goto LAB_0017e9bf;
          }
          if (in_stack_ffffffffffffff44 == LY_STMT_LIST) {
            LVar3 = parse_list(ctx,(lysp_node *)0x0,siblings);
          }
          else {
            if (in_stack_ffffffffffffff44 != LY_STMT_USES) goto LAB_0017eb89;
            LVar3 = parse_uses(ctx,(lysp_node *)0x0,siblings);
          }
        }
      }
      else if ((int)in_stack_ffffffffffffff44 < 0x1e0000) {
        if ((int)in_stack_ffffffffffffff44 < 0x100000) {
          if (in_stack_ffffffffffffff44 == LY_STMT_DEVIATION) {
            LVar3 = parse_deviation(ctx,local_78);
          }
          else if (in_stack_ffffffffffffff44 == LY_STMT_EXTENSION) {
            LVar3 = parse_extension(ctx,local_70);
          }
          else {
            if (in_stack_ffffffffffffff44 != LY_STMT_EXTENSION_INSTANCE) goto LAB_0017eb89;
            LVar3 = parse_ext(ctx,local_a8,local_a0,mod,LY_STMT_MODULE,0,&mod->exts);
          }
        }
        else if ((int)in_stack_ffffffffffffff44 < 0x140000) {
          if (in_stack_ffffffffffffff44 == LY_STMT_FEATURE) {
            LVar3 = parse_feature(ctx,local_68);
          }
          else {
            if (in_stack_ffffffffffffff44 != LY_STMT_IDENTITY) goto LAB_0017eb89;
            LVar3 = parse_identity(ctx,local_58);
          }
        }
        else if (in_stack_ffffffffffffff44 == LY_STMT_IMPORT) {
          LVar3 = parse_import(ctx,mod->mod->prefix,local_90);
        }
        else {
          if (in_stack_ffffffffffffff44 != LY_STMT_INCLUDE) goto LAB_0017eb89;
          LVar3 = parse_include(ctx,mod->mod->name,local_98);
        }
      }
      else if ((int)in_stack_ffffffffffffff44 < 0x270000) {
        if (in_stack_ffffffffffffff44 == LY_STMT_NAMESPACE) {
          parent_stmt_index = (int)mod->mod + 0x18;
          lVar9 = LY_STMT_NAMESPACE;
LAB_0017e9bf:
          value = (char **)0x2;
        }
        else {
          if (in_stack_ffffffffffffff44 == LY_STMT_ORGANIZATION) {
            parent_stmt_index = (int)mod->mod + 0x30;
            lVar9 = LY_STMT_ORGANIZATION;
            goto LAB_0017e9bf;
          }
          if (in_stack_ffffffffffffff44 != LY_STMT_PREFIX) goto LAB_0017eb89;
          plVar6 = (lysp_module *)mod->mod->prefix;
          parent_stmt_index = (int)mod->mod + 0x20;
          lVar9 = LY_STMT_PREFIX;
          value = (char **)0x0;
        }
        LVar3 = parse_text_field(ctx,plVar6,lVar9,parent_stmt_index,value,Y_IDENTIF_ARG,
                                 (uint16_t *)&mod->exts,
                                 (lysp_ext_instance **)
                                 CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      }
      else if ((int)in_stack_ffffffffffffff44 < 0x2f0000) {
        if (in_stack_ffffffffffffff44 == LY_STMT_REFERENCE) {
          parent_stmt_index = (int)mod->mod + 0x48;
          lVar9 = LY_STMT_REFERENCE;
          plVar6 = (lysp_module *)mod->mod->ref;
          goto LAB_0017e9bf;
        }
        if (in_stack_ffffffffffffff44 != LY_STMT_REVISION) goto LAB_0017eb89;
        LVar3 = parse_revision(ctx,local_88);
      }
      else if (in_stack_ffffffffffffff44 == LY_STMT_TYPEDEF) {
        LVar3 = parse_typedef(ctx,(lysp_node *)0x0,local_40);
      }
      else {
        if (in_stack_ffffffffffffff44 != LY_STMT_YANG_VERSION) goto LAB_0017eb89;
        LVar3 = parse_yangversion(ctx,mod);
      }
      if (LVar3 != LY_SUCCESS) {
        return LVar3;
      }
      LVar3 = get_keyword(ctx,(ly_stmt *)&stack0xffffffffffffff44,&local_a8,&local_a0);
      if (LVar3 != LY_SUCCESS) {
        return LVar3;
      }
      if (lVar13 == LY_STMT_SYNTAX_RIGHT_BRACE) {
        bVar12 = true;
        if ((mod->exts != (lysp_ext_instance *)0x0) &&
           (LVar3 = ly_set_add(&ctx->main_ctx->ext_inst,mod->exts,'\x01',(uint32_t *)0x0),
           LVar3 != LY_SUCCESS)) {
          return LVar3;
        }
      }
      lVar9 = in_stack_ffffffffffffff44;
      in_stack_ffffffffffffff44 = lVar13;
    } while (!bVar12);
  }
  plVar1 = mod->mod;
  if (plVar1->ns == (char *)0x0) {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar5 = (ly_ctx *)0x0;
    }
    else {
      plVar5 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    format = "Missing mandatory keyword \"%s\" as a child of \"%s\".";
    pcVar7 = "namespace";
  }
  else {
    if (plVar1->prefix != (char *)0x0) {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar5 = (ly_ctx *)0x0;
      }
      else {
        plVar5 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      plVar4 = ly_ctx_get_submodule_latest(plVar5,plVar1->name);
      if (plVar4 == (lysp_submodule *)0x0) {
        return LY_SUCCESS;
      }
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar5 = (ly_ctx *)0x0;
      }
      else {
        plVar5 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      format = "Name collision between %s and %s of name \"%s\".";
      pcVar7 = "module";
      pcVar8 = "submodule";
      code = LYVE_SEMANTICS;
      goto LAB_0017eb2c;
    }
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar5 = (ly_ctx *)0x0;
    }
    else {
      plVar5 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    format = "Missing mandatory keyword \"%s\" as a child of \"%s\".";
    pcVar7 = "prefix";
  }
LAB_0017eb1e:
  pcVar8 = "module";
  code = LYVE_SYNTAX_YANG;
LAB_0017eb2c:
  ly_vlog(plVar5,(char *)0x0,code,format,pcVar7,pcVar8);
  return LY_EVALID;
}

Assistant:

LY_ERR
parse_module(struct lysp_yang_ctx *ctx, struct lysp_module *mod)
{
    LY_ERR ret = 0;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw, prev_kw = 0;
    enum yang_module_stmt mod_stmt = Y_MOD_MODULE_HEADER;
    const struct lysp_submodule *dup;

    mod->is_submod = 0;

    /* module name */
    LY_CHECK_RET(get_argument(ctx, Y_IDENTIF_ARG, NULL, &word, &buf, &word_len));
    INSERT_WORD_GOTO(ctx, buf, mod->mod->name, word, word_len, ret, cleanup);

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {

#define CHECK_ORDER(SECTION) \
        if (mod_stmt > SECTION) {\
            LOGVAL_PARSER(ctx, LY_VCODE_INORD, lyplg_ext_stmt2str(kw), lyplg_ext_stmt2str(prev_kw)); return LY_EVALID;\
        } mod_stmt = SECTION

        switch (kw) {
        /* module header */
        case LY_STMT_NAMESPACE:
        case LY_STMT_PREFIX:
            CHECK_ORDER(Y_MOD_MODULE_HEADER);
            break;
        case LY_STMT_YANG_VERSION:
            CHECK_ORDER(Y_MOD_MODULE_HEADER);
            break;
        /* linkage */
        case LY_STMT_INCLUDE:
        case LY_STMT_IMPORT:
            CHECK_ORDER(Y_MOD_LINKAGE);
            break;
        /* meta */
        case LY_STMT_ORGANIZATION:
        case LY_STMT_CONTACT:
        case LY_STMT_DESCRIPTION:
        case LY_STMT_REFERENCE:
            CHECK_ORDER(Y_MOD_META);
            break;

        /* revision */
        case LY_STMT_REVISION:
            CHECK_ORDER(Y_MOD_REVISION);
            break;
        /* body */
        case LY_STMT_ANYDATA:
        case LY_STMT_ANYXML:
        case LY_STMT_AUGMENT:
        case LY_STMT_CHOICE:
        case LY_STMT_CONTAINER:
        case LY_STMT_DEVIATION:
        case LY_STMT_EXTENSION:
        case LY_STMT_FEATURE:
        case LY_STMT_GROUPING:
        case LY_STMT_IDENTITY:
        case LY_STMT_LEAF:
        case LY_STMT_LEAF_LIST:
        case LY_STMT_LIST:
        case LY_STMT_NOTIFICATION:
        case LY_STMT_RPC:
        case LY_STMT_TYPEDEF:
        case LY_STMT_USES:
            mod_stmt = Y_MOD_BODY;
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            /* no place in the statement order defined */
            break;
        default:
            /* error handled in the next switch */
            break;
        }
#undef CHECK_ORDER

        prev_kw = kw;
        switch (kw) {
        /* module header */
        case LY_STMT_YANG_VERSION:
            LY_CHECK_RET(parse_yangversion(ctx, mod));
            break;
        case LY_STMT_NAMESPACE:
            LY_CHECK_RET(parse_text_field(ctx, mod, LY_STMT_NAMESPACE, 0, &mod->mod->ns, Y_STR_ARG, NULL, &mod->exts));
            break;
        case LY_STMT_PREFIX:
            LY_CHECK_RET(parse_text_field(ctx, mod->mod->prefix, LY_STMT_PREFIX, 0, &mod->mod->prefix, Y_IDENTIF_ARG,
                    NULL, &mod->exts));
            break;

        /* linkage */
        case LY_STMT_INCLUDE:
            LY_CHECK_RET(parse_include(ctx, mod->mod->name, &mod->includes));
            break;
        case LY_STMT_IMPORT:
            LY_CHECK_RET(parse_import(ctx, mod->mod->prefix, &mod->imports));
            break;

        /* meta */
        case LY_STMT_ORGANIZATION:
            LY_CHECK_RET(parse_text_field(ctx, mod, LY_STMT_ORGANIZATION, 0, &mod->mod->org, Y_STR_ARG, NULL, &mod->exts));
            break;
        case LY_STMT_CONTACT:
            LY_CHECK_RET(parse_text_field(ctx, mod, LY_STMT_CONTACT, 0, &mod->mod->contact, Y_STR_ARG, NULL, &mod->exts));
            break;
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(parse_text_field(ctx, mod->mod->dsc, LY_STMT_DESCRIPTION, 0, &mod->mod->dsc, Y_STR_ARG, NULL,
                    &mod->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(parse_text_field(ctx, mod->mod->ref, LY_STMT_REFERENCE, 0, &mod->mod->ref, Y_STR_ARG, NULL,
                    &mod->exts));
            break;

        /* revision */
        case LY_STMT_REVISION:
            LY_CHECK_RET(parse_revision(ctx, &mod->revs));
            break;

        /* body */
        case LY_STMT_ANYDATA:
            PARSER_CHECK_STMTVER2_RET(ctx, "anydata", "module");
        /* fall through */
        case LY_STMT_ANYXML:
            LY_CHECK_RET(parse_any(ctx, kw, NULL, &mod->data));
            break;
        case LY_STMT_CHOICE:
            LY_CHECK_RET(parse_choice(ctx, NULL, &mod->data));
            break;
        case LY_STMT_CONTAINER:
            LY_CHECK_RET(parse_container(ctx, NULL, &mod->data));
            break;
        case LY_STMT_LEAF:
            LY_CHECK_RET(parse_leaf(ctx, NULL, &mod->data));
            break;
        case LY_STMT_LEAF_LIST:
            LY_CHECK_RET(parse_leaflist(ctx, NULL, &mod->data));
            break;
        case LY_STMT_LIST:
            LY_CHECK_RET(parse_list(ctx, NULL, &mod->data));
            break;
        case LY_STMT_USES:
            LY_CHECK_RET(parse_uses(ctx, NULL, &mod->data));
            break;

        case LY_STMT_AUGMENT:
            LY_CHECK_RET(parse_augment(ctx, NULL, &mod->augments));
            break;
        case LY_STMT_DEVIATION:
            LY_CHECK_RET(parse_deviation(ctx, &mod->deviations));
            break;
        case LY_STMT_EXTENSION:
            LY_CHECK_RET(parse_extension(ctx, &mod->extensions));
            break;
        case LY_STMT_FEATURE:
            LY_CHECK_RET(parse_feature(ctx, &mod->features));
            break;
        case LY_STMT_GROUPING:
            LY_CHECK_RET(parse_grouping(ctx, NULL, &mod->groupings));
            break;
        case LY_STMT_IDENTITY:
            LY_CHECK_RET(parse_identity(ctx, &mod->identities));
            break;
        case LY_STMT_NOTIFICATION:
            LY_CHECK_RET(parse_notif(ctx, NULL, &mod->notifs));
            break;
        case LY_STMT_RPC:
            LY_CHECK_RET(parse_action(ctx, NULL, &mod->rpcs));
            break;
        case LY_STMT_TYPEDEF:
            LY_CHECK_RET(parse_typedef(ctx, NULL, &mod->typedefs));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, mod, LY_STMT_MODULE, 0, &mod->exts));
            break;

        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "module");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, mod->exts, ret, cleanup);
    }

    /* mandatory substatements */
    if (!mod->mod->ns) {
        LOGVAL_PARSER(ctx, LY_VCODE_MISSTMT, "namespace", "module");
        return LY_EVALID;
    } else if (!mod->mod->prefix) {
        LOGVAL_PARSER(ctx, LY_VCODE_MISSTMT, "prefix", "module");
        return LY_EVALID;
    }

    /* submodules share the namespace with the module names, so there must not be
     * a submodule of the same name in the context, no need for revision matching */
    dup = ly_ctx_get_submodule_latest(PARSER_CTX(ctx), mod->mod->name);
    if (dup) {
        LOGVAL_PARSER(ctx, LY_VCODE_NAME2_COL, "module", "submodule", mod->mod->name);
        return LY_EVALID;
    }

cleanup:
    return ret;
}